

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::findOrCreateTexture(SemanticParser *this,SP *in)

{
  map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  mapped_type *pmVar4;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar5;
  undefined1 local_48 [40];
  
  this_00 = (map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
             *)(in + 2);
  pmVar4 = std::
           map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
           ::operator[](this_00,in_RDX);
  if ((pmVar4->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    local_48._24_8_ =
         (in_RDX->super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48._32_8_ =
         (in_RDX->super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count + 1;
      }
    }
    createTextureFrom((SemanticParser *)local_48,in);
    pmVar4 = std::
             map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
             ::operator[](this_00,in_RDX);
    uVar3 = local_48._8_8_;
    uVar2 = local_48._0_8_;
    local_48._0_8_ = (element_type *)0x0;
    local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (pmVar4->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar4->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)uVar2;
    (pmVar4->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_);
    }
  }
  pmVar4 = std::
           map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
           ::operator[](this_00,in_RDX);
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (pmVar4->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (pmVar4->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::findOrCreateTexture(pbrt::syntactic::Texture::SP in)
  {
    if (!textureMapping[in]) {
      textureMapping[in] = createTextureFrom(in);
    }
    return textureMapping[in];
  }